

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

RIP * __thiscall ASDCP::MXF::RIP::WriteToFile(RIP *this,FileWriter *Writer)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ui32_t uVar4;
  size_type sVar5;
  byte_t *pbVar6;
  uint *puVar7;
  undefined8 in_RDX;
  Result_t local_1d0 [104];
  undefined1 local_168 [8];
  MemIOWriter MemWRT;
  Result_t local_150 [104];
  UL local_e8;
  Result_t local_c8 [123];
  undefined1 local_4d;
  int local_4c;
  undefined1 local_48 [4];
  ui32_t RIPSize;
  FrameBuffer Buffer;
  FileWriter *Writer_local;
  RIP *this_local;
  Result_t *result;
  
  if (*(long *)(Writer + 0x70) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x93,"virtual ASDCP::Result_t ASDCP::MXF::RIP::WriteToFile(Kumu::FileWriter &)");
  }
  Buffer._32_8_ = in_RDX;
  FrameBuffer::FrameBuffer((FrameBuffer *)local_48);
  sVar5 = std::__cxx11::
          list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::
          size((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)(Writer + 0x80));
  local_4c = (int)sVar5 * 0xc + 4;
  local_4d = 0;
  FrameBuffer::Capacity((FrameBuffer *)this,(ui32_t)(FrameBuffer *)local_48);
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  uVar1 = Buffer._32_8_;
  if (-1 < iVar3) {
    pbVar6 = Dictionary::ul(*(Dictionary **)(Writer + 0x70),MDD_RandomIndexMetadata);
    UL::UL(&local_e8,pbVar6);
    (**(code **)(*(long *)Writer + 0x60))(local_c8,Writer,uVar1,&local_e8,local_4c);
    Kumu::Result_t::operator=((Result_t *)this,local_c8);
    Kumu::Result_t::~Result_t(local_c8);
    UL::~UL(&local_e8);
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar3) {
    MemWRT.m_size = 0x9d;
    Kumu::Result_t::operator()((int *)local_150,ASDCP::RESULT_KLV_CODING);
    Kumu::Result_t::operator=((Result_t *)this,local_150);
    Kumu::Result_t::~Result_t(local_150);
    pbVar6 = FrameBuffer::Data((FrameBuffer *)local_48);
    uVar4 = FrameBuffer::Capacity((FrameBuffer *)local_48);
    Kumu::MemIOWriter::MemIOWriter((MemIOWriter *)local_168,pbVar6,uVar4);
    bVar2 = SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Archive
                      ((SimpleArray<ASDCP::MXF::RIP::PartitionPair> *)(Writer + 0x78),
                       (MemIOWriter *)local_168);
    if ((bVar2) &&
       (bVar2 = Kumu::MemIOWriter::WriteUi32BE((MemIOWriter *)local_168,local_4c + 0x14), bVar2)) {
      uVar4 = Kumu::MemIOWriter::Length((MemIOWriter *)local_168);
      FrameBuffer::Size((FrameBuffer *)local_48,uVar4);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    }
    Kumu::MemIOWriter::~MemIOWriter((MemIOWriter *)local_168);
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar3) {
    puVar7 = (uint *)FrameBuffer::RoData((FrameBuffer *)local_48);
    FrameBuffer::Size((FrameBuffer *)local_48);
    Kumu::FileWriter::Write((uchar *)local_1d0,Buffer.m_SourceLength,puVar7);
    Kumu::Result_t::operator=((Result_t *)this,local_1d0);
    Kumu::Result_t::~Result_t(local_1d0);
  }
  local_4d = 1;
  FrameBuffer::~FrameBuffer((FrameBuffer *)local_48);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::RIP::WriteToFile(Kumu::FileWriter& Writer)
{
  assert(m_Dict);
  ASDCP::FrameBuffer Buffer;
  ui32_t RIPSize = ( PairArray.size() * (sizeof(ui32_t) + sizeof(ui64_t)) ) + 4;
  Result_t result = Buffer.Capacity(RIPSize);

  if ( ASDCP_SUCCESS(result) )
    result = WriteKLToFile(Writer, m_Dict->ul(MDD_RandomIndexMetadata), RIPSize);

  if ( ASDCP_SUCCESS(result) )
    {
      result = RESULT_KLV_CODING(__LINE__, __FILE__);

      Kumu::MemIOWriter MemWRT(Buffer.Data(), Buffer.Capacity());
      if ( PairArray.Archive(&MemWRT) )
	if ( MemWRT.WriteUi32BE(RIPSize + 20) )
	  {
	    Buffer.Size(MemWRT.Length());
	    result = RESULT_OK;
	  }
    }

  if ( ASDCP_SUCCESS(result) )
    result = Writer.Write(Buffer.RoData(), Buffer.Size());

  return result;
}